

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O1

int __thiscall agg::curve3_inc::init(curve3_inc *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double dVar5;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double dVar6;
  double in_XMM4_Qa;
  double dVar7;
  double in_XMM5_Qa;
  
  *(double *)(this + 0x10) = in_XMM0_Qa;
  *(double *)(this + 0x18) = in_XMM1_Qa;
  *(double *)(this + 0x20) = in_XMM4_Qa;
  *(double *)(this + 0x28) = in_XMM5_Qa;
  dVar3 = in_XMM2_Qa - in_XMM0_Qa;
  dVar5 = in_XMM3_Qa - in_XMM1_Qa;
  dVar4 = dVar3 * dVar3 + dVar5 * dVar5;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar7 = (in_XMM4_Qa - in_XMM2_Qa) * (in_XMM4_Qa - in_XMM2_Qa) +
          (in_XMM5_Qa - in_XMM3_Qa) * (in_XMM5_Qa - in_XMM3_Qa);
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  iVar2 = (int)(long)((dVar4 + dVar7) * 0.25 * *(double *)(this + 8) + 0.5);
  iVar1 = 4;
  if (4 < iVar2) {
    iVar1 = iVar2;
  }
  *(int *)this = iVar1;
  dVar7 = 1.0 / (double)iVar1;
  dVar4 = ((in_XMM0_Qa - (in_XMM2_Qa + in_XMM2_Qa)) + in_XMM4_Qa) * dVar7 * dVar7;
  dVar6 = ((in_XMM1_Qa - (in_XMM3_Qa + in_XMM3_Qa)) + in_XMM5_Qa) * dVar7 * dVar7;
  *(double *)(this + 0x30) = in_XMM0_Qa;
  *(double *)(this + 0x60) = in_XMM0_Qa;
  *(double *)(this + 0x38) = in_XMM1_Qa;
  *(double *)(this + 0x68) = in_XMM1_Qa;
  dVar3 = dVar3 * (dVar7 + dVar7) + dVar4;
  *(double *)(this + 0x40) = dVar3;
  *(double *)(this + 0x70) = dVar3;
  dVar3 = dVar5 * (dVar7 + dVar7) + dVar6;
  *(double *)(this + 0x48) = dVar3;
  *(double *)(this + 0x78) = dVar3;
  *(double *)(this + 0x50) = dVar4 + dVar4;
  *(double *)(this + 0x58) = dVar6 + dVar6;
  *(int *)(this + 4) = iVar1;
  return iVar1;
}

Assistant:

void curve3_inc::init(double x1, double y1, 
                          double x2, double y2, 
                          double x3, double y3)
    {
        m_start_x = x1;
        m_start_y = y1;
        m_end_x   = x3;
        m_end_y   = y3;

        double dx1 = x2 - x1;
        double dy1 = y2 - y1;
        double dx2 = x3 - x2;
        double dy2 = y3 - y2;

        double len = sqrt(dx1 * dx1 + dy1 * dy1) + sqrt(dx2 * dx2 + dy2 * dy2); 

        m_num_steps = uround(len * 0.25 * m_scale);

        if(m_num_steps < 4)
        {
            m_num_steps = 4;   
        }

        double subdivide_step  = 1.0 / m_num_steps;
        double subdivide_step2 = subdivide_step * subdivide_step;

        double tmpx = (x1 - x2 * 2.0 + x3) * subdivide_step2;
        double tmpy = (y1 - y2 * 2.0 + y3) * subdivide_step2;

        m_saved_fx = m_fx = x1;
        m_saved_fy = m_fy = y1;
        
        m_saved_dfx = m_dfx = tmpx + (x2 - x1) * (2.0 * subdivide_step);
        m_saved_dfy = m_dfy = tmpy + (y2 - y1) * (2.0 * subdivide_step);

        m_ddfx = tmpx * 2.0;
        m_ddfy = tmpy * 2.0;

        m_step = m_num_steps;
    }